

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ElementSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,int32_t index,ASTContext *context)

{
  bool bVar1;
  Expression *pEVar2;
  Type *args;
  ElementSelectExpression *this;
  Expression *indexExpr;
  Expression *local_40;
  SVInt local_38;
  
  SVInt::SVInt<int>(&local_38,index);
  pEVar2 = IntegerLiteral::fromConstant(compilation,&local_38);
  SVInt::~SVInt(&local_38);
  local_40 = pEVar2;
  Expression::selfDetermined(context,&local_40);
  args = getIndexedType(compilation,context,(value->type).ptr,local_40->sourceRange,
                        value->sourceRange,false);
  this = BumpAllocator::
         emplace<slang::ast::ElementSelectExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,args,value,local_40,&value->sourceRange);
  bVar1 = Expression::bad(value);
  if (((!bVar1) && (bVar1 = Expression::bad(local_40), !bVar1)) &&
     (bVar1 = Expression::bad(&this->super_Expression), !bVar1)) {
    return &this->super_Expression;
  }
  pEVar2 = Expression::badExpr(compilation,&this->super_Expression);
  return pEVar2;
}

Assistant:

Expression& ElementSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                  int32_t index, const ASTContext& context) {
    Expression* indexExpr = &IntegerLiteral::fromConstant(compilation, index);
    selfDetermined(context, indexExpr);

    const Type& resultType = getIndexedType(compilation, context, *value.type,
                                            indexExpr->sourceRange, value.sourceRange, false);

    auto result = compilation.emplace<ElementSelectExpression>(resultType, value, *indexExpr,
                                                               value.sourceRange);
    if (value.bad() || indexExpr->bad() || result->bad())
        return badExpr(compilation, result);

    return *result;
}